

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseDispatch<void>::
     call<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>,tst_future::canceled_void()::__0,QtPromise::QPromiseCanceledException_const&>
               (QPromiseResolve<void> *resolve,QPromiseReject<void> *reject,
               anon_class_8_1_a7dec128 fn,QPromiseCanceledException *args)

{
  QPromiseCanceledException *args_local;
  QPromiseReject<void> *reject_local;
  QPromiseResolve<void> *resolve_local;
  anon_class_8_1_a7dec128 fn_local;
  
  resolve_local = (QPromiseResolve<void> *)fn.error;
  tst_future::canceled_void::anon_class_8_1_a7dec128::operator()
            ((anon_class_8_1_a7dec128 *)&resolve_local,args);
  QtPromise::QPromiseResolve<void>::operator()(resolve);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            fn(std::forward<Args>(args)...);
            resolve();
        } catch (...) {
            reject(std::current_exception());
        }
    }